

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O2

int mbedtls_camellia_self_test(int verbose)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uchar (*pauVar6) [16];
  uchar (*pauVar7) [48];
  char *pcVar8;
  ulong uVar9;
  size_t __n;
  uchar *puVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uchar src [16];
  uchar local_208 [16];
  size_t offset;
  uchar (*local_1f0) [2] [16];
  uchar (*local_1e8) [2] [16];
  size_t local_1e0;
  uchar nonce_counter [16];
  uchar iv [16];
  uchar key [32];
  uchar stream_block [16];
  uchar buf [64];
  mbedtls_camellia_context ctx;
  
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  for (uVar12 = 0; (int)uVar12 != 6; uVar12 = uVar12 + 1) {
    uVar9 = uVar12 >> 1 & 0x7fffffff;
    iVar4 = (int)uVar9;
    uVar13 = iVar4 * 0x40 + 0x80;
    if (verbose != 0) {
      pcVar8 = "enc";
      if ((uVar12 & 1) == 0) {
        pcVar8 = "dec";
      }
      printf("  CAMELLIA-ECB-%3d (%s): ",(ulong)uVar13,pcVar8);
    }
    local_1e8 = camellia_test_ecb_cipher + (uVar12 >> 1);
    local_1e0 = (size_t)(iVar4 * 8 + 0x10);
    local_1f0 = camellia_test_ecb_cipher + uVar9;
    lVar11 = 0;
    lVar5 = 0;
    while (lVar5 + 0x10 != 0x30) {
      puVar10 = key;
      memcpy(puVar10,camellia_test_ecb_key[uVar12 >> 1][0] + lVar5 * 2,local_1e0);
      if ((uVar12 & 1) == 0) {
        mbedtls_camellia_setkey_dec(&ctx,puVar10,uVar13);
        iVar4 = (int)puVar10;
        puVar10 = (*local_1e8)[0] + lVar5;
        src._0_8_ = *(undefined8 *)puVar10;
        src._8_8_ = *(undefined8 *)(puVar10 + 8);
        pauVar6 = (uchar (*) [16])(camellia_test_ecb_plain[0] + lVar5);
      }
      else {
        mbedtls_camellia_setkey_enc(&ctx,puVar10,uVar13);
        iVar4 = (int)puVar10;
        src._0_8_ = *(undefined8 *)(camellia_test_ecb_plain[0] + lVar5);
        src._8_8_ = *(undefined8 *)(camellia_test_ecb_plain[0] + lVar5 + 8);
        pauVar6 = *local_1f0 + lVar11;
      }
      lVar11 = lVar11 + 1;
      uVar1 = *(undefined8 *)*pauVar6;
      uVar2 = *(undefined8 *)(*pauVar6 + 8);
      mbedtls_camellia_crypt_ecb(&ctx,iVar4,src,buf);
      local_208[0] = (uchar)uVar1;
      local_208[1] = (uchar)((ulong)uVar1 >> 8);
      local_208[2] = (uchar)((ulong)uVar1 >> 0x10);
      local_208[3] = (uchar)((ulong)uVar1 >> 0x18);
      local_208[4] = (uchar)((ulong)uVar1 >> 0x20);
      local_208[5] = (uchar)((ulong)uVar1 >> 0x28);
      local_208[6] = (uchar)((ulong)uVar1 >> 0x30);
      local_208[7] = (uchar)((ulong)uVar1 >> 0x38);
      local_208[8] = (uchar)uVar2;
      local_208[9] = (uchar)((ulong)uVar2 >> 8);
      local_208[10] = (uchar)((ulong)uVar2 >> 0x10);
      local_208[0xb] = (uchar)((ulong)uVar2 >> 0x18);
      local_208[0xc] = (uchar)((ulong)uVar2 >> 0x20);
      local_208[0xd] = (uchar)((ulong)uVar2 >> 0x28);
      local_208[0xe] = (uchar)((ulong)uVar2 >> 0x30);
      local_208[0xf] = (uchar)((ulong)uVar2 >> 0x38);
      auVar14[0] = -(buf[0] == local_208[0]);
      auVar14[1] = -(buf[1] == local_208[1]);
      auVar14[2] = -(buf[2] == local_208[2]);
      auVar14[3] = -(buf[3] == local_208[3]);
      auVar14[4] = -(buf[4] == local_208[4]);
      auVar14[5] = -(buf[5] == local_208[5]);
      auVar14[6] = -(buf[6] == local_208[6]);
      auVar14[7] = -(buf[7] == local_208[7]);
      auVar14[8] = -(buf[8] == local_208[8]);
      auVar14[9] = -(buf[9] == local_208[9]);
      auVar14[10] = -(buf[10] == local_208[10]);
      auVar14[0xb] = -(buf[0xb] == local_208[0xb]);
      auVar14[0xc] = -(buf[0xc] == local_208[0xc]);
      auVar14[0xd] = -(buf[0xd] == local_208[0xd]);
      auVar14[0xe] = -(buf[0xe] == local_208[0xe]);
      auVar14[0xf] = -(buf[0xf] == local_208[0xf]);
      lVar5 = lVar5 + 0x10;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016c172;
    }
    if (verbose != 0) {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar12 = 0; (uint)uVar12 != 6; uVar12 = uVar12 + 1) {
    uVar9 = uVar12 >> 1 & 0x7fffffff;
    iVar4 = (int)uVar9;
    if (verbose != 0) {
      pcVar8 = "enc";
      if ((uVar12 & 1) == 0) {
        pcVar8 = "dec";
      }
      printf("  CAMELLIA-CBC-%3d (%s): ",(ulong)(iVar4 * 0x40 + 0x80),pcVar8);
    }
    src[0] = '\0';
    src[1] = '\x01';
    src[2] = '\x02';
    src[3] = '\x03';
    src[4] = '\x04';
    src[5] = '\x05';
    src[6] = '\x06';
    src[7] = '\a';
    src[8] = '\b';
    src[9] = '\t';
    src[10] = '\n';
    src[0xb] = '\v';
    src[0xc] = '\f';
    src[0xd] = '\r';
    src[0xe] = '\x0e';
    src[0xf] = '\x0f';
    local_208[0] = '\0';
    local_208[1] = '\x01';
    local_208[2] = '\x02';
    local_208[3] = '\x03';
    local_208[4] = '\x04';
    local_208[5] = '\x05';
    local_208[6] = '\x06';
    local_208[7] = '\a';
    local_208[8] = '\b';
    local_208[9] = '\t';
    local_208[10] = '\n';
    local_208[0xb] = '\v';
    local_208[0xc] = '\f';
    local_208[0xd] = '\r';
    local_208[0xe] = '\x0e';
    local_208[0xf] = '\x0f';
    memcpy(key,camellia_test_cbc_key + uVar9,(ulong)(iVar4 * 8 + 0x10));
    uVar13 = iVar4 * 0x40 + 0x80;
    if ((uVar12 & 1) == 0) {
      mbedtls_camellia_setkey_dec(&ctx,key,uVar13);
    }
    else {
      mbedtls_camellia_setkey_enc(&ctx,key,uVar13);
    }
    lVar11 = 0;
    lVar5 = 0;
    while (lVar5 + 0x10 != 0x40) {
      if ((uVar12 & 1) == 0) {
        iv[0] = src[0];
        iv[1] = src[1];
        iv[2] = src[2];
        iv[3] = src[3];
        iv[4] = src[4];
        iv[5] = src[5];
        iv[6] = src[6];
        iv[7] = src[7];
        iv[8] = src[8];
        iv[9] = src[9];
        iv[10] = src[10];
        iv[0xb] = src[0xb];
        iv[0xc] = src[0xc];
        iv[0xd] = src[0xd];
        iv[0xe] = src[0xe];
        iv[0xf] = src[0xf];
        puVar10 = camellia_test_cbc_cipher[uVar12 >> 1][0] + lVar5;
        src._0_8_ = *(undefined8 *)puVar10;
        src._8_8_ = *(undefined8 *)(puVar10 + 8);
        pauVar6 = (uchar (*) [16])(camellia_test_cbc_plain[0] + lVar5);
      }
      else {
        iv[0] = local_208[0];
        iv[1] = local_208[1];
        iv[2] = local_208[2];
        iv[3] = local_208[3];
        iv[4] = local_208[4];
        iv[5] = local_208[5];
        iv[6] = local_208[6];
        iv[7] = local_208[7];
        iv[8] = local_208[8];
        iv[9] = local_208[9];
        iv[10] = local_208[10];
        iv[0xb] = local_208[0xb];
        iv[0xc] = local_208[0xc];
        iv[0xd] = local_208[0xd];
        iv[0xe] = local_208[0xe];
        iv[0xf] = local_208[0xf];
        src._0_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar5);
        src._8_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar5 + 8);
        pauVar6 = camellia_test_cbc_cipher[uVar9] + lVar11;
      }
      lVar11 = lVar11 + 1;
      local_208._0_8_ = *(undefined8 *)*pauVar6;
      local_208._8_8_ = *(undefined8 *)(*pauVar6 + 8);
      mbedtls_camellia_crypt_cbc(&ctx,(uint)uVar12 & 1,0x10,iv,src,buf);
      auVar15[0] = -(buf[0] == local_208[0]);
      auVar15[1] = -(buf[1] == local_208[1]);
      auVar15[2] = -(buf[2] == local_208[2]);
      auVar15[3] = -(buf[3] == local_208[3]);
      auVar15[4] = -(buf[4] == local_208[4]);
      auVar15[5] = -(buf[5] == local_208[5]);
      auVar15[6] = -(buf[6] == local_208[6]);
      auVar15[7] = -(buf[7] == local_208[7]);
      auVar15[8] = -(buf[8] == local_208[8]);
      auVar15[9] = -(buf[9] == local_208[9]);
      auVar15[10] = -(buf[10] == local_208[10]);
      auVar15[0xb] = -(buf[0xb] == local_208[0xb]);
      auVar15[0xc] = -(buf[0xc] == local_208[0xc]);
      auVar15[0xd] = -(buf[0xd] == local_208[0xd]);
      auVar15[0xe] = -(buf[0xe] == local_208[0xe]);
      auVar15[0xf] = -(buf[0xf] == local_208[0xf]);
      lVar5 = lVar5 + 0x10;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016c172;
    }
    if (verbose != 0) {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  uVar13 = 0;
  while( true ) {
    if (uVar13 == 6) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    if (verbose != 0) {
      pcVar8 = "enc";
      if ((uVar13 & 1) == 0) {
        pcVar8 = "dec";
      }
      printf("  CAMELLIA-CTR-128 (%s): ",pcVar8);
    }
    uVar3 = uVar13 >> 1;
    nonce_counter._0_8_ = *(undefined8 *)camellia_test_ctr_nonce_counter[uVar3];
    nonce_counter._8_8_ = *(undefined8 *)(camellia_test_ctr_nonce_counter[uVar3] + 8);
    key._0_16_ = *(undefined1 (*) [16])(camellia_test_ctr_key + uVar3);
    offset = 0;
    mbedtls_camellia_setkey_enc(&ctx,key,0x80);
    __n = (size_t)camellia_test_ctr_len[uVar3];
    if ((uVar13 & 1) == 0) {
      memcpy(buf,camellia_test_ctr_ct + uVar3,__n);
      mbedtls_camellia_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
      pauVar7 = camellia_test_ctr_pt;
    }
    else {
      memcpy(buf,camellia_test_ctr_pt + uVar3,__n);
      mbedtls_camellia_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
      pauVar7 = camellia_test_ctr_ct;
    }
    iVar4 = bcmp(buf,pauVar7 + uVar3,__n);
    if (iVar4 != 0) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar13 = uVar13 + 1;
  }
  if (verbose == 0) {
    return 1;
  }
LAB_0016c17c:
  puts("failed");
  return 1;
LAB_0016c172:
  if (verbose == 0) {
    return 1;
  }
  goto LAB_0016c17c;
}

Assistant:

int mbedtls_camellia_self_test( int verbose )
{
    int i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char src[16];
    unsigned char dst[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    size_t offset, len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif

    mbedtls_camellia_context ctx;

    memset( key, 0, 32 );

    for( j = 0; j < 6; j++ ) {
        u = j >> 1;
    v = j & 1;

    if( verbose != 0 )
        mbedtls_printf( "  CAMELLIA-ECB-%3d (%s): ", 128 + u * 64,
                         (v == MBEDTLS_CAMELLIA_DECRYPT) ? "dec" : "enc");

    for( i = 0; i < CAMELLIA_TESTS_ECB; i++ ) {
        memcpy( key, camellia_test_ecb_key[u][i], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_cipher[u][i], 16 );
            memcpy( dst, camellia_test_ecb_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_plain[i], 16 );
            memcpy( dst, camellia_test_ecb_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_ecb( &ctx, v, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( j = 0; j < 6; j++ )
    {
        u = j >> 1;
        v = j  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

    memcpy( src, camellia_test_cbc_iv, 16 );
    memcpy( dst, camellia_test_cbc_iv, 16 );
    memcpy( key, camellia_test_cbc_key[u], 16 + 8 * u );

    if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
        mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
    } else {
        mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
    }

    for( i = 0; i < CAMELLIA_TESTS_CBC; i++ ) {

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            memcpy( iv , src, 16 );
            memcpy( src, camellia_test_cbc_cipher[u][i], 16 );
            memcpy( dst, camellia_test_cbc_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            memcpy( iv , dst, 16 );
            memcpy( src, camellia_test_cbc_plain[i], 16 );
            memcpy( dst, camellia_test_cbc_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_cbc( &ctx, v, 16, iv, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CTR-128 (%s): ",
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, camellia_test_ctr_nonce_counter[u], 16 );
        memcpy( key, camellia_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_camellia_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_CAMELLIA_DECRYPT )
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_ct[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }
        else
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_pt[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    return( 0 );
}